

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsdeviceintegration.cpp
# Opt level: O2

void __thiscall
QEglFSDeviceIntegration::waitForVSync(QEglFSDeviceIntegration *this,QPlatformSurface *surface)

{
  int iVar1;
  long in_FS_OFFSET;
  int arg;
  char local_30 [24];
  char *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (waitForVSync(QPlatformSurface*)::forceSync == '\0') {
    iVar1 = __cxa_guard_acquire(&waitForVSync(QPlatformSurface*)::forceSync);
    if (iVar1 != 0) {
      iVar1 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_FORCEVSYNC",(bool *)0x0);
      waitForVSync::forceSync = iVar1 != 0;
      __cxa_guard_release(&waitForVSync(QPlatformSurface*)::forceSync);
    }
  }
  if ((framebuffer != -1 & waitForVSync::forceSync) == 1) {
    local_c = 0;
    iVar1 = ioctl(framebuffer,0x40044620);
    if (iVar1 == -1) {
      local_30[0] = '\x02';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_30[0x14] = '\0';
      local_30[0x15] = '\0';
      local_30[0x16] = '\0';
      local_30[0x17] = '\0';
      local_30[4] = '\0';
      local_30[5] = '\0';
      local_30[6] = '\0';
      local_30[7] = '\0';
      local_30[8] = '\0';
      local_30[9] = '\0';
      local_30[10] = '\0';
      local_30[0xb] = '\0';
      local_30[0xc] = '\0';
      local_30[0xd] = '\0';
      local_30[0xe] = '\0';
      local_30[0xf] = '\0';
      local_30[0x10] = '\0';
      local_30[0x11] = '\0';
      local_30[0x12] = '\0';
      local_30[0x13] = '\0';
      local_18 = "default";
      QMessageLogger::warning(local_30,"Could not wait for vsync.");
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEglFSDeviceIntegration::waitForVSync(QPlatformSurface *surface) const
{
    Q_UNUSED(surface);

#if defined(Q_OS_LINUX) && defined(FBIO_WAITFORVSYNC)
    static const bool forceSync = qEnvironmentVariableIntValue("QT_QPA_EGLFS_FORCEVSYNC");
    if (forceSync && framebuffer != -1) {
        int arg = 0;
        if (ioctl(framebuffer, FBIO_WAITFORVSYNC, &arg) == -1)
            qWarning("Could not wait for vsync.");
    }
#endif
}